

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O3

WriteNLResult *
mp::WriteNLFile<mp::NLW2_NLFeeder_C_Impl>
          (WriteNLResult *__return_storage_ptr__,string *namebase,NLW2_NLFeeder_C_Impl *nlf,
          NLUtils *utl)

{
  long lVar1;
  undefined4 *puVar2;
  undefined4 *puVar3;
  FILE *__stream;
  byte bVar4;
  NLHeader_C h_c;
  undefined1 local_2a8 [16];
  NLW2_NLFeeder_C_Impl *local_298;
  undefined1 local_290 [144];
  int local_200;
  undefined4 local_1fc [3];
  int local_1f0;
  undefined4 local_1ec;
  NLFormat local_1e8;
  undefined4 local_1e4 [24];
  undefined8 local_184;
  int iStack_17c;
  int iStack_178;
  int iStack_174;
  NLW2_WriteNLResultCode NStack_170;
  undefined4 uStack_16c;
  _Alloc_hider local_168;
  _Alloc_hider local_160;
  undefined1 local_158 [28];
  undefined4 local_13c [25];
  undefined1 local_d8 [168];
  
  bVar4 = 0;
  (*(nlf->nlf2_c_).Header)((NLHeader_C *)local_2a8,(nlf->nlf2_c_).p_user_data_);
  memcpy(local_d8,local_2a8,0xa8);
  puVar2 = local_1fc;
  puVar3 = local_13c;
  for (lVar1 = 0x19; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar3 = *puVar2;
    puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
    puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
  }
  local_2a8._0_8_ = utl;
  if (local_200 == 0) {
    memcpy(local_290,local_d8,0xa8);
    puVar2 = local_13c;
    puVar3 = local_1e4;
    for (lVar1 = 0x19; lVar1 != 0; lVar1 = lVar1 + -1) {
      *puVar3 = *puVar2;
      puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
      puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
    }
    local_2a8._8_8_ = ((ulong)local_2a8._8_8_ >> 8 & 0xffffff) << 8;
    local_1e8 = 0;
    iStack_17c = 0;
    iStack_178 = 0;
    iStack_174 = 0;
    NStack_170 = NLW2_WriteNL_Unset;
    uStack_16c = 0;
    local_168._M_p._0_4_ = NLW2_WriteNL_Unset;
    local_158._0_8_ = 0;
    local_158[8] = '\0';
    local_298 = nlf;
    local_160._M_p = local_158 + 8;
    NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLW2_NLFeeder_C_Impl>_>::WriteFiles
              (__return_storage_ptr__,
               (NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLW2_NLFeeder_C_Impl>_> *)
               local_2a8,namebase);
    if (local_160._M_p != local_158 + 8) {
      operator_delete(local_160._M_p,CONCAT71(local_158._9_7_,local_158[8]) + 1);
    }
    __stream = (FILE *)CONCAT44(uStack_16c,NStack_170);
  }
  else {
    memcpy(&local_298,local_d8,0xa8);
    puVar2 = local_13c;
    puVar3 = &local_1ec;
    for (lVar1 = 0x19; lVar1 != 0; lVar1 = lVar1 + -1) {
      *puVar3 = *puVar2;
      puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
      puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
    }
    local_1f0 = local_200;
    local_184._0_4_ = 0;
    local_184._4_4_ = 0;
    iStack_17c = 0;
    iStack_178 = 0;
    iStack_174 = 0;
    NStack_170 = NLW2_WriteNL_Unset;
    local_160._M_p = (pointer)0x0;
    local_158._0_8_ = local_158._0_8_ & 0xffffffffffffff00;
    local_2a8._8_8_ = nlf;
    local_168._M_p = local_158;
    NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLW2_NLFeeder_C_Impl>_>::WriteFiles
              (__return_storage_ptr__,
               (NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLW2_NLFeeder_C_Impl>_> *)
               local_2a8,namebase);
    if (local_168._M_p != local_158) {
      operator_delete(local_168._M_p,local_158._0_8_ + 1);
    }
    __stream = (FILE *)CONCAT44(iStack_174,iStack_178);
  }
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  return __return_storage_ptr__;
}

Assistant:

inline WriteNLResult WriteNLFile(
    const std::string& namebase,
    NLFeeder& nlf, NLUtils& utl) {
  auto h = nlf.Header();
  if (NLHeader::TEXT == h.format) {
    mp::NLWriter2<
        mp::NLWriter2Params<
        mp::TextFormatter, NLFeeder > >
        writer(nlf, h, utl);
    return writer.WriteFiles(namebase);
  } else {
    mp::NLWriter2<
        mp::NLWriter2Params<
        mp::BinaryFormatter, NLFeeder > >
        writer(nlf, h, utl);
    return writer.WriteFiles(namebase);
  }
}